

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall CGL::AppConfig::AppConfig(AppConfig *this)

{
  undefined8 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  std::__cxx11::string::string((string *)(in_RDI + 0x11));
  std::__cxx11::string::string((string *)(in_RDI + 0x17));
  *in_RDI = 1;
  in_RDI[1] = 1;
  in_RDI[2] = 1;
  in_RDI[3] = 1;
  in_RDI[4] = 1;
  in_RDI[5] = 1;
  in_RDI[6] = 1;
  in_RDI[7] = 0;
  in_RDI[9] = 0x20;
  *(undefined4 *)(in_RDI + 8) = 0x3d4ccccd;
  *(undefined1 *)(in_RDI + 10) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb),"");
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0x4012cccccccccccd;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x11),"");
  in_RDI[0x16] = 0x4039000000000000;
  in_RDI[0x15] = 0x3ff0000000000000;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x17),"");
  return;
}

Assistant:

AppConfig () {

    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 1;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;

    pathtracer_samples_per_patch = 32;
    pathtracer_max_tolerance = 0.05f;
    pathtracer_direct_hemisphere_sample = false;

    pathtracer_filename = "";
    pathtracer_lensRadius = 0.0;
    pathtracer_focalDistance = 4.7;

    // Begin Lens Flare implementation
    aperture_filename = "";
    pathtracer_lens_flare_radius = 25.0;
    pathtracer_lens_flare_intensity = 1;
		ghost_aperture_filename = "";
  }